

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O2

void __thiscall
GF2::MP<8UL,_GF2::MOGrevlex<8UL>_>::SymDiff(MP<8UL,_GF2::MOGrevlex<8UL>_> *this,MM<8UL> *mRight)

{
  _List_iterator<GF2::MM<8UL>_> __position;
  
  __position = std::
               __lower_bound<std::_List_iterator<GF2::MM<8ul>>,GF2::MM<8ul>,__gnu_cxx::__ops::_Iter_comp_val<GF2::MOGrevlex<8ul>>>
                         ((this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>).
                          super__List_base<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>._M_impl.
                          _M_node.super__List_node_base._M_next,this,mRight);
  if ((__position._M_node != (_List_node_base *)this) &&
     (__position._M_node[1]._M_next == (_List_node_base *)(mRight->super_WW<8UL>)._words[0])) {
    std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::erase
              (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>,
               (const_iterator)__position._M_node);
    return;
  }
  std::__cxx11::list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>::insert
            (&this->super_list<GF2::MM<8UL>,_std::allocator<GF2::MM<8UL>_>_>,
             (const_iterator)__position._M_node,mRight);
  return;
}

Assistant:

void SymDiff(const MM<_n>& mRight)
	{	
		// находим первую позицию в списке, вставка в которую mRight 
		// не нарушит порядок
		iterator iter = std::lower_bound(begin(), end(), mRight, _order);
		// нет mRight?
		if (iter == end() || *iter != mRight)
			insert(iter, mRight);
		else
			erase(iter);
	}